

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::BuildFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,size_t offset,string *code_ptr)

{
  IdlNamer *pIVar1;
  Value *type;
  string *this_00;
  string field_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_b0,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_50,pIVar1,struct_def);
  std::operator+(&local_d0,"func ",&local_50);
  std::operator+(&local_f0,&local_d0,"Add");
  (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_70,pIVar1,field);
  std::operator+(&local_110,&local_f0,&local_70);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&local_110,&local_b0," ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_110);
  type = &field->value;
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) || (struct_def->fixed != false)) {
    GenTypeGet_abi_cxx11_(&local_110,this,&type->type);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  GenMethod_abi_cxx11_(&local_110,this,field);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_110);
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  else {
    NumToString<unsigned_long>(&local_d0,offset);
    std::operator+(&local_f0,"Slot(",&local_d0);
    std::operator+(&local_110,&local_f0,", ");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (((type->type).base_type - BASE_TYPE_UTYPE < 0xc) || (struct_def->fixed != false)) {
    std::__cxx11::string::string((string *)&local_90,(string *)&local_b0);
    CastToBaseType(&local_110,this,&type->type,&local_90);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    this_00 = &local_90;
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_f0,"(",&local_b0);
    std::operator+(&local_110,&local_f0,")");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_110);
    this_00 = &local_f0;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::append((char *)code_ptr);
    NumToString<unsigned_long>(&local_f0,offset);
    std::operator+(&local_110,"\tbuilder.Slot(",&local_f0);
    std::__cxx11::string::append((string *)code_ptr);
  }
  else {
    GenConstant_abi_cxx11_(&local_f0,this,field);
    std::operator+(&local_110,", ",&local_f0);
    std::__cxx11::string::append((string *)code_ptr);
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void BuildFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                         const size_t offset, std::string *code_ptr) {
    std::string &code = *code_ptr;
    const std::string field_var = namer_.Variable(field);
    code += "func " + namer_.Type(struct_def) + "Add" + namer_.Function(field);
    code += "(builder *flatbuffers.Builder, ";
    code += field_var + " ";
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.UOffsetT";
    } else {
      code += GenTypeGet(field.value.type);
    }
    code += ") {\n\t";
    code += "builder.Prepend";
    code += GenMethod(field);
    if (field.IsScalarOptional()) {
      code += "(";
    } else {
      code += "Slot(" + NumToString(offset) + ", ";
    }
    if (!IsScalar(field.value.type.base_type) && (!struct_def.fixed)) {
      code += "flatbuffers.UOffsetT";
      code += "(" + field_var + ")";
    } else {
      code += CastToBaseType(field.value.type, field_var);
    }
    if (field.IsScalarOptional()) {
      code += ")\n";
      code += "\tbuilder.Slot(" + NumToString(offset);
    } else {
      code += ", " + GenConstant(field);
    }
    code += ")\n";
    code += "}\n";
  }